

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lupica.c
# Opt level: O0

StageResult stage_multiplier(Emulator *e)

{
  int iVar1;
  int iVar2;
  u32 *regs;
  int steps;
  StageMM *mm;
  Emulator *e_local;
  
  if (((e->state).pipeline.mm.s.active & 1U) != 0) {
    if (1 < e->verbosity) {
      print_stage((e->state).pipeline.mm.s,"multiply");
      printf("%*s",0x1e,"");
    }
    iVar1 = stage_multiplier::mul_steps[(e->state).pipeline.mm.mul.type];
    iVar2 = (e->state).pipeline.mm.s.step + 1;
    (e->state).pipeline.mm.s.step = iVar2;
    if (iVar2 < iVar1) {
      if (1 < e->verbosity) {
        printf("; processing...");
      }
      (e->state).pipeline.mm.s.active = true;
    }
    else {
      if ((e->state).pipeline.mm.mul.type != MULTIPLIER_MULU) {
        fprintf(_stderr,"unexpected multiplier type: %d",(ulong)(e->state).pipeline.mm.mul.type);
        exit(1);
      }
      (e->state).reg[0x13] = (e->state).pipeline.mm.mul.rm * (e->state).pipeline.mm.mul.rn;
      print_registers(e,1,0x13);
      (e->state).pipeline.mm.s.active = false;
    }
    if (1 < e->verbosity) {
      printf("\n");
    }
  }
  return STAGE_RESULT_OK;
}

Assistant:

StageResult stage_multiplier(Emulator* e) {
  StageMM* mm = &e->state.pipeline.mm;

  if (!mm->s.active) {
    return STAGE_RESULT_OK;
  }

  if (e->verbosity > 1) {
    print_stage(mm->s, "multiply");
    printf("%*s", INSTR_COLUMNS, "");
  }

  static const int mul_steps[] = {
    2, /* MULTIPLIER_MULUW */
    2, /* MULTIPLIER_MULSW */
    2, /* MULTIPLIER_MACW */
    4, /* MULTIPLIER_MACL */
    4, /* MULTIPLIER_DMULSL */
    4, /* MULTIPLIER_DMULUL */
    4, /* MULTIPLIER_MULL */
  };

  int steps = mul_steps[mm->mul.type];
  if (++mm->s.step < steps) {
    if (e->verbosity > 1) {
      printf("; processing...");
    }
    mm->s.active = true;
  } else {
    u32* regs = &e->state.reg[0];

    switch (mm->mul.type) {
      case MULTIPLIER_MULU:
        regs[REGISTER_MACL] = mm->mul.rm * mm->mul.rn;
        print_registers(e, 1, REGISTER_MACL);
        break;

      default:
        UNREACHABLE("unexpected multiplier type: %d", mm->mul.type);
        break;
    }

    mm->s.active = false;
  }

  if (e->verbosity > 1) {
    printf("\n");
  }

  return STAGE_RESULT_OK;
}